

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveCardsOperationSnapshotCreator.cpp
# Opt level: O0

void __thiscall
solitaire::archivers::MoveCardsOperationSnapshotCreator::saveSourcePileSnapshot
          (MoveCardsOperationSnapshotCreator *this,
          unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
          *snapshot)

{
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  *snapshot_local;
  MoveCardsOperationSnapshotCreator *this_local;
  
  throwIfSourcePileSnapshotIsNotNullptr(this);
  throwIfSnapshotIsNullptr(this,snapshot);
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::operator=(&this->sourcePileSnapshot,snapshot);
  return;
}

Assistant:

void MoveCardsOperationSnapshotCreator::saveSourcePileSnapshot(
    std::unique_ptr<interfaces::Snapshot> snapshot)
{
    throwIfSourcePileSnapshotIsNotNullptr();
    throwIfSnapshotIsNullptr(snapshot);
    sourcePileSnapshot = std::move(snapshot);
}